

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

ER __thiscall
slang::ast::ForeverLoopStatement::evalImpl(ForeverLoopStatement *this,EvalContext *context)

{
  ER EVar1;
  ER result;
  EvalContext *context_local;
  ForeverLoopStatement *this_local;
  
  while( true ) {
    do {
      EVar1 = Statement::eval(this->body,context);
    } while (EVar1 == Success);
    if (EVar1 == Break) break;
    if (EVar1 != Continue) {
      return EVar1;
    }
  }
  return Success;
}

Assistant:

ER ForeverLoopStatement::evalImpl(EvalContext& context) const {
    while (true) {
        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}